

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

void __thiscall HyperLogLog::ParseHyperLogLog(HyperLogLog *this,char *line,size_t *index)

{
  uint64_t uVar1;
  int i;
  long lVar2;
  size_t index_last;
  size_t index_first;
  size_t local_30;
  size_t local_28;
  
  ParseCsvCell(line,index,&local_28,&local_30);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar1 = ParseUint64Cell(line,index);
    this->hllv[lVar2] = (uint8_t)uVar1;
  }
  return;
}

Assistant:

void HyperLogLog::ParseHyperLogLog(char const* line, size_t* index)
{
    /* Skip the float value */
    size_t index_first;
    size_t index_last;
    ParseCsvCell(line, index, &index_first, &index_last);
    for (int i = 0; i < 16; i++) {
        hllv[i] = (uint8_t)ParseUint64Cell(line, index);
    }
}